

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::Persistence_landscape::Persistence_landscape
          (Persistence_landscape *this,char *filename,size_t dimension,size_t number_of_levels)

{
  double dVar1;
  undefined1 auVar2 [16];
  allocator<char> local_c9;
  string local_c8;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_a8;
  allocator<char> local_79;
  string local_78;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_58;
  undefined1 local_40 [8];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> barcode;
  size_t number_of_levels_local;
  size_t dimension_local;
  char *filename_local;
  Persistence_landscape *this_local;
  
  barcode.super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)number_of_levels;
  std::
  vector<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>,_std::allocator<std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>_>_>
  ::vector(&this->land);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  auVar2._8_4_ = (int)(dimension >> 0x20);
  auVar2._0_8_ = dimension;
  auVar2._12_4_ = 0x45300000;
  dVar1 = std::numeric_limits<double>::max();
  if (dVar1 <= (auVar2._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)dimension) - 4503599627370496.0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,filename,&local_c9);
    read_persistence_intervals_in_one_dimension_from_file(&local_a8,&local_c8,-1,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_a8);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,filename,&local_79);
    read_persistence_intervals_in_one_dimension_from_file(&local_58,&local_78,(int)dimension,-1.0);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::operator=
              ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
               local_40,&local_58);
    std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
              (&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  construct_persistence_landscape_from_barcode
            (this,(vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                  local_40,
             (size_t)barcode.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  set_up_numbers_of_functions_for_vectorization_and_projections_to_reals(this);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::~vector
            ((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
             local_40);
  return;
}

Assistant:

Persistence_landscape::Persistence_landscape(const char* filename, size_t dimension, size_t number_of_levels) {
  std::vector<std::pair<double, double> > barcode;
  if (dimension < std::numeric_limits<double>::max()) {
    barcode = read_persistence_intervals_in_one_dimension_from_file(filename, dimension);
  } else {
    barcode = read_persistence_intervals_in_one_dimension_from_file(filename);
  }
  this->construct_persistence_landscape_from_barcode(barcode, number_of_levels);
  this->set_up_numbers_of_functions_for_vectorization_and_projections_to_reals();
}